

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz_Dice.c
# Opt level: O1

void lastBlankingTime(void)

{
  int iVar1;
  
  iVar1 = 0x28;
  do {
    putchar(line_cnt | 0xd);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  putchar(line_cnt | 0xd);
  iVar1 = 6;
  do {
    putchar(line_cnt | 9);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 1;
  do {
    putchar(line_cnt | 0xd);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  putchar(line_cnt | 0xc);
  return;
}

Assistant:

void lastBlankingTime() {

    // Blanking
    for(int i=0;i<(640/16);i++) {
        putchar(0b00001101|line_cnt);
    }

    // Front Porch
    for(int i=0; i<(16/16); i++) {
        putchar(0b00001101|line_cnt);
    }

    // hSync
    for(int i=0;i<(96/16);i++) {
        putchar(0b00001001|line_cnt);
    }

    // Back Porch
    for(int i=0; i<((48/16)-1); i++) {
        putchar(0b00001101|line_cnt);
    }

    // Counter Reset
    putchar(0b00001100|line_cnt);
}